

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuadaptor.cpp
# Opt level: O0

QList<int> * __thiscall
QDBusMenuAdaptor::AboutToShowGroup(QDBusMenuAdaptor *this,QList<int> *ids,QList<int> *idErrors)

{
  bool bVar1;
  const_iterator o;
  int *piVar2;
  char *in_RSI;
  QLoggingCategory *in_RDI;
  long in_FS_OFFSET;
  int id;
  QList<int> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *this_00;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  QDebug *in_stack_ffffffffffffff78;
  const_iterator local_50 [5];
  QDebug local_28;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QtPrivateLogging::qLcMenu();
  anon_unknown.dwarf_1e2e9c4::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)this_00,in_RDI);
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_1e2e9c4::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xae8ab9);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_RSI,(int)((ulong)this_00 >> 0x20),(char *)in_RDI,(char *)0xae8acf);
    QMessageLogger::debug();
    ::operator<<(in_stack_ffffffffffffff78,
                 (QList<int> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    QDebug::~QDebug(&local_20);
    QDebug::~QDebug(&local_28);
    local_10 = 0;
  }
  QList<int>::clear((QList<int> *)this_00);
  local_50[0].i = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_50[0] = QList<int>::begin((QList<int> *)this_00);
  o = QList<int>::end((QList<int> *)this_00);
  while( true ) {
    bVar1 = QList<int>::const_iterator::operator!=(local_50,o);
    if (!bVar1) break;
    piVar2 = QList<int>::const_iterator::operator*(local_50);
    AboutToShow((QDBusMenuAdaptor *)CONCAT44(*piVar2,in_stack_ffffffffffffff70),
                (int)((ulong)in_RSI >> 0x20));
    QList<int>::const_iterator::operator++(local_50);
  }
  in_RDI->d = (void *)0x0;
  in_RDI->name = (char *)0x0;
  in_RDI->field_2 = (anon_union_4_2_7218e939_for_QLoggingCategory_2)0x0;
  in_RDI->placeholder[0] = false;
  in_RDI->placeholder[1] = false;
  in_RDI->placeholder[2] = false;
  in_RDI->placeholder[3] = false;
  QList<int>::QList((QList<int> *)0xae8bdb);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<int> *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> QDBusMenuAdaptor::AboutToShowGroup(const QList<int> &ids, QList<int> &idErrors)
{
    qCDebug(qLcMenu) << ids;
    Q_UNUSED(idErrors);
    idErrors.clear();
    for (int id : ids)
        AboutToShow(id);
    return QList<int>(); // updatesNeeded
}